

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O1

string * __thiscall
setup::filename_map::expand_variables
          (string *__return_storage_ptr__,filename_map *this,it *begin,it end,bool close)

{
  char cVar1;
  ulong uVar2;
  pointer pcVar3;
  filename_map *this_00;
  bool bVar4;
  char cVar5;
  ulong uVar6;
  ulong uVar7;
  char *pcVar8;
  it iVar9;
  string local_80;
  filename_map *local_60;
  it *local_58;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_60 = this;
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  pcVar8 = begin->_M_current;
  local_58 = begin;
  do {
    if (pcVar8 == end._M_current) {
      return __return_storage_ptr__;
    }
    pcVar8 = begin->_M_current;
    iVar9._M_current = pcVar8;
    for (; ((pcVar8 != end._M_current && (iVar9._M_current = pcVar8, *pcVar8 != '{')) &&
           (*pcVar8 != '}')); pcVar8 = pcVar8 + 1) {
      iVar9._M_current = end._M_current;
    }
    uVar7 = __return_storage_ptr__->_M_string_length;
    uVar6 = uVar7;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar7,(char *)0x0,(ulong)begin->_M_current);
    uVar2 = __return_storage_ptr__->_M_string_length;
    if (uVar7 != uVar2) {
      pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
      do {
        cVar1 = pcVar3[uVar7];
        bVar4 = anon_unknown_0::is_unsafe_path_char::operator()
                          ((is_unsafe_path_char *)(ulong)(uint)(int)cVar1,(char)uVar6);
        cVar5 = '$';
        if (!bVar4) {
          cVar5 = cVar1;
        }
        pcVar3[uVar7] = cVar5;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    begin = local_58;
    this_00 = local_60;
    local_58->_M_current = iVar9._M_current;
    if (iVar9._M_current == end._M_current) {
      bVar4 = false;
    }
    else {
      pcVar8 = local_58->_M_current + 1;
      local_58->_M_current = pcVar8;
      if (close) {
        if (*iVar9._M_current != '}') {
          if (!close) goto LAB_00136a18;
          goto LAB_00136a32;
        }
        bVar4 = false;
      }
      else {
LAB_00136a18:
        if (*iVar9._M_current == '}') {
          bVar4 = true;
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
        }
        else {
LAB_00136a32:
          if ((pcVar8 == end._M_current) || (*pcVar8 != '{')) {
            expand_variables(&local_50,local_60,local_58,end,true);
            lookup(&local_80,this_00,&local_50);
            std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_80._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            begin->_M_current = begin->_M_current + 1;
          }
          bVar4 = true;
        }
      }
    }
    if (!bVar4) {
      return __return_storage_ptr__;
    }
    pcVar8 = begin->_M_current;
  } while( true );
}

Assistant:

std::string filename_map::expand_variables(it & begin, it end, bool close) const {
	
	std::string result;
	result.reserve(size_t(end - begin));
	
	while(begin != end) {
		
		// Flush everything before the next bracket
		it pos = begin;
		while(pos != end && *pos != '{' && *pos != '}') {
			++pos;
		}
		ptrdiff_t obegin = ptrdiff_t(result.size());
		result.append(begin, pos);
		std::replace_copy_if(result.begin() + obegin, result.end(), result.begin() + obegin,
		                     is_unsafe_path_char(), '$');
		begin = pos;
		
		if(pos == end) {
			// No more variables or escape sequences
			break;
		}
		
		begin++;
		
		if(close && *pos == '}') {
			// Current context closed
			break;
		}
		
		if(!close && *pos == '}') {
			// literal '}' character
			result.push_back('}');
			continue;
		}
		
		// '{{' escape sequence
		if(begin != end && *begin == '{') {
			result.push_back('{');
			begin++;
			continue;
		}
		
		// Recursively expand variables until we reach the end of this context
		result.append(lookup(expand_variables(begin, end, true)));
	}
	
	return result;
}